

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::GetBitOperator,bool,false,false>
               (string_t *ldata,int *rdata,int *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  unsigned_long *puVar5;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  char **ppcVar21;
  idx_t iVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  string_t input;
  string_t input_00;
  string_t input_01;
  char **local_70;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_70 = &(ldata->value).pointer.ptr;
      iVar22 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_70 + -1);
        uVar4 = paVar1->length;
        uVar8 = paVar1->prefix[0];
        uVar11 = paVar1->prefix[1];
        uVar14 = paVar1->prefix[2];
        uVar17 = paVar1->prefix[3];
        input_01.value.pointer.prefix[3] = uVar17;
        input_01.value.pointer.prefix[2] = uVar14;
        input_01.value.pointer.prefix[1] = uVar11;
        input_01.value.pointer.prefix[0] = uVar8;
        input_01.value.pointer.length = uVar4;
        input_01.value.pointer.ptr = *local_70;
        iVar18 = GetBitOperator::Operation<duckdb::string_t,int,int>(input_01,rdata[iVar22]);
        result_data[iVar22] = iVar18;
        iVar22 = iVar22 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar22);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar19 = 0;
    uVar25 = 0;
    do {
      puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        uVar20 = 0xffffffffffffffff;
      }
      else {
        uVar20 = puVar5[uVar19];
      }
      uVar24 = uVar25 + 0x40;
      if (count <= uVar25 + 0x40) {
        uVar24 = count;
      }
      uVar23 = uVar24;
      if (uVar20 != 0) {
        uVar23 = uVar25;
        if (uVar20 == 0xffffffffffffffff) {
          if (uVar25 < uVar24) {
            ppcVar21 = &ldata[uVar25].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar21 + -1);
              uVar2 = paVar1->length;
              uVar6 = paVar1->prefix[0];
              uVar9 = paVar1->prefix[1];
              uVar12 = paVar1->prefix[2];
              uVar15 = paVar1->prefix[3];
              input.value.pointer.prefix[3] = uVar15;
              input.value.pointer.prefix[2] = uVar12;
              input.value.pointer.prefix[1] = uVar9;
              input.value.pointer.prefix[0] = uVar6;
              input.value.pointer.length = uVar2;
              input.value.pointer.ptr = *ppcVar21;
              iVar18 = GetBitOperator::Operation<duckdb::string_t,int,int>(input,rdata[uVar25]);
              result_data[uVar25] = iVar18;
              uVar25 = uVar25 + 1;
              ppcVar21 = ppcVar21 + 2;
              uVar23 = uVar25;
            } while (uVar24 != uVar25);
          }
        }
        else if (uVar25 < uVar24) {
          ppcVar21 = &ldata[uVar25].value.pointer.ptr;
          uVar23 = 0;
          do {
            if ((uVar20 >> (uVar23 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar21 + -1);
              uVar3 = paVar1->length;
              uVar7 = paVar1->prefix[0];
              uVar10 = paVar1->prefix[1];
              uVar13 = paVar1->prefix[2];
              uVar16 = paVar1->prefix[3];
              input_00.value.pointer.prefix[3] = uVar16;
              input_00.value.pointer.prefix[2] = uVar13;
              input_00.value.pointer.prefix[1] = uVar10;
              input_00.value.pointer.prefix[0] = uVar7;
              input_00.value.pointer.length = uVar3;
              input_00.value.pointer.ptr = *ppcVar21;
              iVar18 = GetBitOperator::Operation<duckdb::string_t,int,int>
                                 (input_00,rdata[uVar25 + uVar23]);
              result_data[uVar25 + uVar23] = iVar18;
            }
            uVar23 = uVar23 + 1;
            ppcVar21 = ppcVar21 + 2;
          } while ((uVar25 - uVar24) + uVar23 != 0);
          uVar23 = uVar25 + uVar23;
        }
      }
      uVar19 = uVar19 + 1;
      uVar25 = uVar23;
    } while (uVar19 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}